

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void __thiscall notch::core::FullyConnectedLayer::update(FullyConnectedLayer *this)

{
  bool bVar1;
  logic_error *this_00;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  FullyConnectedLayer *this_local;
  
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->policy);
  if (!bVar1) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    ::std::logic_error::logic_error(this_00,"learning policy is not defined");
    __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
  }
  peVar2 = std::
           __shared_ptr_access<notch::core::ALearningPolicy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<notch::core::ALearningPolicy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->policy);
  peVar3 = std::__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->weights);
  peVar4 = std::__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->bias);
  peVar5 = std::__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->weightSensitivity);
  peVar6 = std::__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->biasSensitivity);
  (**peVar2->_vptr_ALearningPolicy)(peVar2,peVar3,peVar4,peVar5,peVar6);
  return;
}

Assistant:

virtual void update() {
        if (!policy) {
            throw std::logic_error("learning policy is not defined");
        }
        policy->update(*weights, *bias, *weightSensitivity, *biasSensitivity);
    }